

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O2

void __thiscall
ser::Serializer::ReadField
          (Serializer *this,string *fieldName,Savepoint *savepoint,void *pData,int iStride,
          int jStride,int kStride,int lStride,bool alsoPrevious)

{
  uint savepointID;
  int iVar1;
  StellaOutputProxy *pSVar2;
  DataFieldInfo *this_00;
  type pFVar3;
  ostream *poVar4;
  SerializationException *this_01;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  vector<char,_std::allocator<char>_> binaryData;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  void *pData_local;
  allocator_type local_268 [32];
  undefined8 local_248;
  undefined8 local_240;
  ifstream fs;
  
  local_248 = CONCAT44(in_register_0000008c,jStride);
  local_240 = CONCAT44(in_register_00000084,iStride);
  if (-1 < enabled_) {
    pData_local = pData;
    stella::detail::StellaOutput::operator<<((StellaOutput *)&binaryData,(char (*) [17])&sout);
    pSVar2 = stella::detail::StellaOutputProxy::operator<<
                       ((StellaOutputProxy *)&binaryData,fieldName);
    pSVar2 = stella::detail::StellaOutputProxy::operator<<(pSVar2,(char (*) [15])0x17b1c6);
    Savepoint::ToString_abi_cxx11_((string *)&fs,savepoint);
    pSVar2 = stella::detail::StellaOutputProxy::operator<<(pSVar2,(string *)&fs);
    pSVar2 = stella::detail::StellaOutputProxy::operator<<(pSVar2,(char (*) [15])" into data at ");
    pSVar2 = stella::detail::StellaOutputProxy::operator<<(pSVar2,&pData_local);
    stella::detail::StellaOutputProxy::operator<<(pSVar2,(char (*) [2])0x179141);
    std::__cxx11::string::~string((string *)&fs);
    this_00 = FieldsTable::Find(&this->fieldsTable_,fieldName);
    savepointID = OffsetTable::GetSavepointID(&this->offsetTable_,savepoint);
    if ((int)savepointID < 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fs);
      poVar4 = std::operator<<((ostream *)&fs,"Error: the requested savepoint ");
      Savepoint::ToString_abi_cxx11_((string *)&binaryData,savepoint);
      poVar4 = std::operator<<(poVar4,(string *)&binaryData);
      std::operator<<(poVar4," does not exist in the serializer.");
      std::__cxx11::string::~string((string *)&binaryData);
      binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__SerializationException_00199680;
      binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&local_280;
      binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_280._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign
                ((string *)
                 &binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      std::__cxx11::string::~string((string *)local_268);
      this_01 = (SerializationException *)__cxa_allocate_exception(0x28);
      SerializationException::SerializationException(this_01,(SerializationException *)&binaryData);
      __cxa_throw(this_01,&SerializationException::typeinfo,
                  SerializationException::~SerializationException);
    }
    if (alsoPrevious) {
      OffsetTable::GetOffset(&this->offsetTable_,savepointID,fieldName);
      stella::detail::StellaOutput::operator<<((StellaOutput *)&fs,(char (*) [26])&sout);
      pSVar2 = stella::detail::StellaOutputProxy::operator<<((StellaOutputProxy *)&fs,savepoint);
      stella::detail::StellaOutputProxy::operator<<(pSVar2,(char (*) [2])0x179141);
    }
    std::ifstream::ifstream(&fs);
    pFVar3 = boost::shared_ptr<ser::FileFormat>::operator->(&this->pFileFormat_);
    (*pFVar3->_vptr_FileFormat[7])
              (pFVar3,&fs,fieldName,
               (this->offsetTable_).savepoints_.
               super__Vector_base<ser::Savepoint,_std::allocator<ser::Savepoint>_>._M_impl.
               super__Vector_impl_data._M_start + savepointID);
    iVar1 = DataFieldInfo::dataSize(this_00);
    std::vector<char,_std::allocator<char>_>::vector(&binaryData,(long)iVar1,local_268);
    std::istream::read((char *)&fs,
                       (long)binaryData.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    BinarySerializer::ReadArray
              (&this->binarySerializer_,pData_local,this_00->bytesPerElement_,this_00->iSize_,
               this_00->jSize_,this_00->kSize_,this_00->lSize_,(int)local_240,(int)local_248,kStride
               ,lStride,&binaryData);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&binaryData.super__Vector_base<char,_std::allocator<char>_>);
    std::ifstream::~ifstream(&fs);
  }
  return;
}

Assistant:

void Serializer::ReadField(const std::string& fieldName, const Savepoint& savepoint,
        void* pData, int iStride, int jStride, int kStride, int lStride, bool alsoPrevious) const
{
    // Don't read if serialization is disabeld
    if (enabled_ < 0) return;

    sout << "Requested field " << fieldName << " at savepoint " << savepoint.ToString()
         << " into data at " << pData << "\n";

    // Retrieve field info
    // (It will throw an exception is the field is not yet registered)
    const DataFieldInfo& info = fieldsTable_.Find(fieldName);

    // Search savepoint
    int savepointID = offsetTable_.GetSavepointID(savepoint);
    if (savepointID < 0)
    {
        // Throw exception
        std::ostringstream errorstr;
        errorstr << "Error: the requested savepoint " << savepoint.ToString()
            << " does not exist in the serializer.";
        SerializationException exception;
        exception.Init(errorstr.str());
        throw exception;
    }

    // Search in previous savepoints
    if (alsoPrevious)
    {
        OffsetTable::offset_t offset;
        bool found = false;
        while(!found)
        {
            try
            {
                offsetTable_.GetOffset(savepointID, fieldName);

                // Field is found
                found = true;
                break;
            }
            catch (SerializationException&)
            {
                // Field is not found: proceed with previous savepoint
            }

            if(--savepointID < 0)
                break;
        }

        if (savepointID < 0)
        {
            std::ostringstream errorstr;
            errorstr << "Error: field " << fieldName << " is never serialized "
                     << "at or before savepoint " << savepoint << "\n";
            SerializationException exception;
            exception.Init(errorstr.str());
            throw exception;
        }

        sout << "Field found at savepoint " << savepoint << "\n";
    }

    // Open file stream
    // (This will check if the field is saved at savepoint and throw otherwise)
    std::ifstream fs;
    pFileFormat_->OpenStreamRead(fs, fieldName, offsetTable_.savepoints()[savepointID]);

    // Read data into buffer
    std::vector<char> binaryData(info.dataSize());
    fs.read(binaryData.data(), binaryData.size());

    // Read data into array
    binarySerializer_.ReadArray(pData, info.bytesPerElement(),
            info.iSize(), info.jSize(), info.kSize(), info.lSize(),
            iStride, jStride, kStride, lStride, binaryData);
}